

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O2

bool __thiscall BamTools::ConvertTool::ConvertToolPrivate::Run(ConvertToolPrivate *this)

{
  char cVar1;
  bool bVar2;
  __type _Var3;
  string *__x;
  istream *piVar4;
  ostream *poVar5;
  char *pcVar6;
  ConvertSettings *pCVar7;
  code *pcVar8;
  BamMultiReader reader;
  BamRegion local_398;
  string line;
  ofstream outFile;
  undefined4 uStack_22c;
  byte abStack_210 [488];
  
  pCVar7 = this->m_settings;
  if ((pCVar7->HasInput == false) && (pCVar7->HasInputFilelist == false)) {
    __x = Options::StandardIn_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pCVar7->InputFiles,__x);
    pCVar7 = this->m_settings;
  }
  if (pCVar7->HasInputFilelist == true) {
    std::ifstream::ifstream(&outFile,(pCVar7->InputFilelist)._M_dataplus._M_p,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "bamtools convert ERROR: could not open input BAM file list... Aborting."
                              );
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      while (piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&outFile,(string *)&line),
            ((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->m_settings->InputFiles,&line);
      }
      std::__cxx11::string::~string((string *)&line);
    }
    std::ifstream::~ifstream(&outFile);
    if (cVar1 == '\0') {
      return false;
    }
  }
  BamMultiReader::BamMultiReader(&reader);
  bVar2 = BamMultiReader::Open(&reader,&this->m_settings->InputFiles);
  if (bVar2) {
    if ((this->m_settings->HasInput == true) && (this->m_settings->HasRegion == true)) {
      _outFile = 1;
      bVar2 = BamMultiReader::LocateIndexes(&reader,(IndexType *)&outFile);
      if (!bVar2) {
        pcVar6 = "bamtools convert ERROR: could not locate index file(s)... Aborting.";
        goto LAB_0010ded8;
      }
    }
    BamMultiReader::GetReferenceData((RefVector *)&outFile,&reader);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator=
              (&this->m_references,
               (vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)&outFile);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector
              ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)&outFile);
    local_398.LeftRefID = -1;
    local_398.LeftPosition = -1;
    local_398.RightRefID = -1;
    local_398.RightPosition = -1;
    if (this->m_settings->HasRegion != true) {
LAB_0010de49:
      std::ofstream::ofstream(&outFile);
      pCVar7 = this->m_settings;
      if (pCVar7->HasOutput == true) {
        std::ofstream::open((char *)&outFile,
                            (_Ios_Openmode)(pCVar7->OutputFilename)._M_dataplus._M_p);
        if ((abStack_210[*(long *)(CONCAT44(uStack_22c,_outFile) + -0x18)] & 5) == 0) {
          std::ios::rdbuf((streambuf *)(&this->m_out + *(long *)(*(long *)&this->m_out + -0x18)));
          pCVar7 = this->m_settings;
          goto LAB_0010df55;
        }
        poVar5 = std::operator<<((ostream *)&std::cerr,"bamtools convert ERROR: could not open ");
        poVar5 = std::operator<<(poVar5,(string *)&this->m_settings->OutputFilename);
        poVar5 = std::operator<<(poVar5," for output");
        std::endl<char,std::char_traits<char>>(poVar5);
        bVar2 = false;
      }
      else {
LAB_0010df55:
        _Var3 = std::operator==(&pCVar7->Format,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )FORMAT_PILEUP_abi_cxx11_);
        if (_Var3) {
          bVar2 = RunPileupConversion(this,&reader);
        }
        else {
          _Var3 = std::operator==(&this->m_settings->Format,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)FORMAT_BED_abi_cxx11_);
          if (_Var3) {
            pcVar8 = PrintBed;
          }
          else {
            _Var3 = std::operator==(&this->m_settings->Format,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)FORMAT_FASTA_abi_cxx11_);
            if (_Var3) {
              pcVar8 = PrintFasta;
            }
            else {
              _Var3 = std::operator==(&this->m_settings->Format,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)FORMAT_FASTQ_abi_cxx11_);
              if (_Var3) {
                pcVar8 = PrintFastq;
              }
              else {
                _Var3 = std::operator==(&this->m_settings->Format,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)FORMAT_JSON_abi_cxx11_);
                if (_Var3) {
                  pcVar8 = PrintJson;
                }
                else {
                  _Var3 = std::operator==(&this->m_settings->Format,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)FORMAT_SAM_abi_cxx11_);
                  if (_Var3) {
                    pcVar8 = PrintSam;
                  }
                  else {
                    _Var3 = std::operator==(&this->m_settings->Format,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)FORMAT_YAML_abi_cxx11_);
                    if (!_Var3) {
                      poVar5 = std::operator<<((ostream *)&std::cerr,
                                               "bamtools convert ERROR: unrecognized format: ");
                      poVar5 = std::operator<<(poVar5,(string *)&this->m_settings->Format);
                      std::endl<char,std::char_traits<char>>(poVar5);
                      poVar5 = std::operator<<((ostream *)&std::cerr,
                                               "Please see documentation for list of supported formats "
                                              );
                      std::endl<char,std::char_traits<char>>(poVar5);
                      bVar2 = false;
                      goto LAB_0010e0f1;
                    }
                    pcVar8 = PrintYaml;
                  }
                }
              }
            }
          }
          _Var3 = std::operator==(&this->m_settings->Format,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)FORMAT_SAM_abi_cxx11_);
          if ((_Var3) && (this->m_settings->IsOmittingSamHeader == false)) {
            BamMultiReader::GetHeaderText_abi_cxx11_(&line,&reader);
            std::operator<<(&this->m_out,(string *)&line);
            std::__cxx11::string::~string((string *)&line);
          }
          BamAlignment::BamAlignment((BamAlignment *)&line);
          while (bVar2 = BamMultiReader::GetNextAlignment(&reader,(BamAlignment *)&line), bVar2) {
            (*pcVar8)(this,(BamAlignment *)&line);
          }
          BamAlignment::~BamAlignment((BamAlignment *)&line);
          bVar2 = true;
        }
LAB_0010e0f1:
        BamMultiReader::Close(&reader);
        if (this->m_settings->HasOutput == true) {
          std::ofstream::close();
        }
      }
      std::ofstream::~ofstream(&outFile);
      goto LAB_0010e11e;
    }
    bVar2 = Utilities::ParseRegionString(&this->m_settings->Region,&reader,&local_398);
    if (bVar2) {
      bVar2 = BamMultiReader::HasIndexes(&reader);
      if ((!bVar2) || (bVar2 = BamMultiReader::SetRegion(&reader,&local_398), bVar2))
      goto LAB_0010de49;
      pcVar6 = 
      "bamtools convert ERROR: set region failed. Check that REGION describes a valid range";
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "bamtools convert ERROR: could not parse REGION: ");
      poVar5 = std::operator<<(poVar5,(string *)&this->m_settings->Region);
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar6 = 
      "Check that REGION is in valid format (see documentation) and that the coordinates are valid";
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    BamMultiReader::Close(&reader);
  }
  else {
    pcVar6 = "bamtools convert ERROR: could not open input BAM file(s)... Aborting.";
LAB_0010ded8:
    poVar5 = std::operator<<((ostream *)&std::cerr,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  bVar2 = false;
LAB_0010e11e:
  BamMultiReader::~BamMultiReader(&reader);
  return bVar2;
}

Assistant:

bool ConvertTool::ConvertToolPrivate::Run()
{

    // ------------------------------------
    // initialize conversion input/output

    // set to default input if none provided
    if (!m_settings->HasInput && !m_settings->HasInputFilelist) {
        m_settings->InputFiles.push_back(Options::StandardIn());
    }

    // add files in the filelist to the input file list
    if (m_settings->HasInputFilelist) {

        std::ifstream filelist(m_settings->InputFilelist.c_str(), std::ios::in);
        if (!filelist.is_open()) {
            std::cerr << "bamtools convert ERROR: could not open input BAM file list... Aborting."
                      << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(filelist, line)) {
            m_settings->InputFiles.push_back(line);
        }
    }

    // open input files
    BamMultiReader reader;
    if (!reader.Open(m_settings->InputFiles)) {
        std::cerr << "bamtools convert ERROR: could not open input BAM file(s)... Aborting."
                  << std::endl;
        return false;
    }

    // if input is not stdin & a region is provided, look for index files
    if (m_settings->HasInput && m_settings->HasRegion) {
        if (!reader.LocateIndexes()) {
            std::cerr << "bamtools convert ERROR: could not locate index file(s)... Aborting."
                      << std::endl;
            return false;
        }
    }

    // retrieve reference data
    m_references = reader.GetReferenceData();

    // set region if specified
    BamRegion region;
    if (m_settings->HasRegion) {
        if (Utilities::ParseRegionString(m_settings->Region, reader, region)) {

            if (reader.HasIndexes()) {
                if (!reader.SetRegion(region)) {
                    std::cerr << "bamtools convert ERROR: set region failed. Check that REGION "
                                 "describes a valid range"
                              << std::endl;
                    reader.Close();
                    return false;
                }
            }

        } else {
            std::cerr << "bamtools convert ERROR: could not parse REGION: " << m_settings->Region
                      << std::endl;
            std::cerr << "Check that REGION is in valid format (see documentation) and that the "
                         "coordinates are valid"
                      << std::endl;
            reader.Close();
            return false;
        }
    }

    // if output file given
    std::ofstream outFile;
    if (m_settings->HasOutput) {

        // open output file stream
        outFile.open(m_settings->OutputFilename.c_str());
        if (!outFile) {
            std::cerr << "bamtools convert ERROR: could not open " << m_settings->OutputFilename
                      << " for output" << std::endl;
            return false;
        }

        // set m_out to file's streambuf
        m_out.rdbuf(outFile.rdbuf());
    }

    // -------------------------------------
    // do conversion based on format

    bool convertedOk = true;

    // pileup is special case
    // conversion not done per alignment, like the other formats
    if (m_settings->Format == FORMAT_PILEUP) {
        convertedOk = RunPileupConversion(&reader);

        // all other formats
    } else {

        bool formatError = false;

        // set function pointer to proper conversion method
        void (BamTools::ConvertTool::ConvertToolPrivate::*pFunction)(const BamAlignment&) = 0;
        if (m_settings->Format == FORMAT_BED) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintBed;
        } else if (m_settings->Format == FORMAT_FASTA) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintFasta;
        } else if (m_settings->Format == FORMAT_FASTQ) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintFastq;
        } else if (m_settings->Format == FORMAT_JSON) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintJson;
        } else if (m_settings->Format == FORMAT_SAM) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintSam;
        } else if (m_settings->Format == FORMAT_YAML) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintYaml;
        } else {
            std::cerr << "bamtools convert ERROR: unrecognized format: " << m_settings->Format
                      << std::endl;
            std::cerr << "Please see documentation for list of supported formats " << std::endl;
            formatError = true;
            convertedOk = false;
        }

        // if format selected ok
        if (!formatError) {

            // if SAM format & not omitting header, print SAM header first
            if ((m_settings->Format == FORMAT_SAM) && !m_settings->IsOmittingSamHeader) {
                m_out << reader.GetHeaderText();
            }

            try {
                // iterate through file, doing conversion
                BamAlignment a;
                while (reader.GetNextAlignment(a)) {
                    (this->*pFunction)(a);
                }

                // set flag for successful conversion
                convertedOk = true;
            } catch (const BadDataException& e) {
                std::cerr << "Conversion failed : " << e.what() << '\n';

                convertedOk = false;
            }
        }
    }

    // ------------------------
    // clean up & exit
    reader.Close();
    if (m_settings->HasOutput) {
        outFile.close();
    }
    return convertedOk;
}